

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::prepareFileForWrite(QPDFWriter *this)

{
  bool bVar1;
  QPDFObjectHandle adbe;
  QPDFObjectHandle oh;
  QPDFObjectHandle root;
  allocator<char> local_69;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  string local_58;
  undefined1 local_38 [16];
  QPDFObjectHandle local_28;
  
  QPDF::fixDanglingReferences
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pdf,false);
  QPDF::getRoot((QPDF *)&stack0xffffffffffffffe8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"/Extensions",(allocator<char> *)&local_68);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_38,(string *)&stack0xffffffffffffffe8);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_38);
  if (bVar1) {
    bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"/Extensions",&local_69);
      QPDFObjectHandle::shallowCopy(&local_28);
      QPDFObjectHandle::replaceKeyAndGetNew
                ((QPDFObjectHandle *)&local_68,(string *)&stack0xffffffffffffffe8,
                 (QPDFObjectHandle *)&local_58);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_38,&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_28.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"/ADBE",(allocator<char> *)&local_68);
    bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"/ADBE",(allocator<char> *)&local_28);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_68,(string *)local_38);
      std::__cxx11::string::~string((string *)&local_58);
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_68);
      if (bVar1) {
        QPDFObjectHandle::makeDirect((QPDFObjectHandle *)&local_68,false);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"/ADBE",(allocator<char> *)&local_28);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_38,&local_58,(QPDFObjectHandle *)&local_68);
        std::__cxx11::string::~string((string *)&local_58);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return;
}

Assistant:

void
QPDFWriter::prepareFileForWrite()
{
    m->pdf.fixDanglingReferences();
    auto root = m->pdf.getRoot();
    auto oh = root.getKey("/Extensions");
    if (oh.isDictionary()) {
        const bool extensions_indirect = oh.isIndirect();
        if (extensions_indirect) {
            QTC::TC("qpdf", "QPDFWriter make Extensions direct");
            oh = root.replaceKeyAndGetNew("/Extensions", oh.shallowCopy());
        }
        if (oh.hasKey("/ADBE")) {
            auto adbe = oh.getKey("/ADBE");
            if (adbe.isIndirect()) {
                QTC::TC("qpdf", "QPDFWriter make ADBE direct", extensions_indirect ? 0 : 1);
                adbe.makeDirect();
                oh.replaceKey("/ADBE", adbe);
            }
        }
    }
}